

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ConsumeString(Parser *this,string *output,char *error)

{
  TokenType TVar1;
  Tokenizer *pTVar2;
  ErrorCollector *pEVar3;
  undefined1 *local_48 [2];
  undefined1 local_38 [23];
  allocator local_21;
  
  pTVar2 = this->input_;
  TVar1 = (pTVar2->current_).type;
  if (TVar1 == TYPE_STRING) {
    output->_M_string_length = 0;
    *(output->_M_dataplus)._M_p = '\0';
    do {
      io::Tokenizer::ParseStringAppend(&(pTVar2->current_).text,output);
      io::Tokenizer::Next(this->input_);
      pTVar2 = this->input_;
    } while ((pTVar2->current_).type == TYPE_STRING);
  }
  else {
    std::__cxx11::string::string((string *)local_48,error,&local_21);
    pEVar3 = this->error_collector_;
    if (pEVar3 != (ErrorCollector *)0x0) {
      (*pEVar3->_vptr_ErrorCollector[2])
                (pEVar3,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,local_48);
    }
    this->had_errors_ = true;
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  return TVar1 == TYPE_STRING;
}

Assistant:

bool Parser::ConsumeString(std::string* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
    io::Tokenizer::ParseString(input_->current().text, output);
    input_->Next();
    // Allow C++ like concatenation of adjacent string tokens.
    while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      io::Tokenizer::ParseStringAppend(input_->current().text, output);
      input_->Next();
    }
    return true;
  } else {
    AddError(error);
    return false;
  }
}